

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribute.c
# Opt level: O3

int distribute_start(mixed_segment *segment)

{
  undefined8 uVar1;
  uint uVar2;
  undefined4 uVar3;
  long *plVar4;
  undefined8 *puVar5;
  long lVar6;
  undefined8 uVar7;
  int iVar8;
  ulong uVar9;
  
  plVar4 = (long *)segment->data;
  puVar5 = (undefined8 *)plVar4[2];
  if (puVar5 == (undefined8 *)0x0) {
    mixed_err(0x16);
    iVar8 = 0;
  }
  else {
    uVar2 = *(uint *)(plVar4 + 1);
    if ((ulong)uVar2 != 0) {
      lVar6 = *plVar4;
      uVar7 = *puVar5;
      uVar1 = puVar5[1];
      uVar3 = *(undefined4 *)(puVar5 + 2);
      uVar9 = 0;
      do {
        puVar5 = *(undefined8 **)(lVar6 + uVar9 * 8);
        *puVar5 = uVar7;
        puVar5[1] = uVar1;
        *(undefined4 *)(puVar5 + 2) = uVar3;
        uVar9 = uVar9 + 1;
      } while (uVar2 != uVar9);
    }
    *(undefined4 *)(plVar4 + 3) = 0;
    iVar8 = 1;
  }
  return iVar8;
}

Assistant:

int distribute_start(struct mixed_segment *segment){
  struct distribute_data *data = (struct distribute_data *)segment->data;
  struct mixed_buffer *in = data->in;

  if(!in){
    mixed_err(MIXED_BUFFER_MISSING);
    return 0;
  }

  for(uint32_t i=0; i<data->count; ++i){
    struct mixed_buffer *buffer = data->out[i];
    buffer->_data = in->_data;
    buffer->size = in->size;
    buffer->read = in->read;
    buffer->write = in->write;
  }

  data->was_available = 0;
  return 1;
}